

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoMocUic.cxx
# Opt level: O0

void __thiscall
cmQtAutoMocUic::JobT::LogCommandError
          (JobT *this,GenT genType,string *message,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *command,string *output)

{
  cmQtAutoMocUic *pcVar1;
  Logger *this_00;
  string *output_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *command_local;
  string *message_local;
  GenT genType_local;
  JobT *this_local;
  
  pcVar1 = Gen(this);
  AbortError(pcVar1);
  pcVar1 = Gen(this);
  this_00 = cmQtAutoMocUic::Log(pcVar1);
  cmQtAutoGenerator::Logger::ErrorCommand(this_00,genType,message,command,output);
  return;
}

Assistant:

void cmQtAutoMocUic::JobT::LogCommandError(
  GenT genType, std::string const& message,
  std::vector<std::string> const& command, std::string const& output) const
{
  Gen()->AbortError();
  Gen()->Log().ErrorCommand(genType, message, command, output);
}